

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

void helper_store_601_batl_ppc64(CPUPPCState_conflict2 *env,uint32_t nr,target_ulong value)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)nr;
  uVar1 = env->pb[uVar2 - 0xd];
  if (uVar1 != value) {
    if ((uVar1 & 0x40) != 0) {
      do_invalidate_BAT(env,env->IBAT[0][uVar2],(ulong)(((uint)uVar1 & 0x7ff) << 0x11));
    }
    if ((value & 0x40) != 0) {
      do_invalidate_BAT(env,env->IBAT[0][uVar2],(ulong)(((uint)value & 0x7ff) << 0x11));
    }
    env->pb[uVar2 - 0xd] = value;
    env->DBAT[1][uVar2] = value;
  }
  return;
}

Assistant:

void helper_store_601_batl(CPUPPCState *env, uint32_t nr, target_ulong value)
{
#if !defined(FLUSH_ALL_TLBS)
    target_ulong mask;
#else
    PowerPCCPU *cpu = env_archcpu(env);
    int do_inval;
#endif

    dump_store_bat(env, 'I', 1, nr, value);
    if (env->IBAT[1][nr] != value) {
#if defined(FLUSH_ALL_TLBS)
        do_inval = 0;
#endif
        if (env->IBAT[1][nr] & 0x40) {
#if !defined(FLUSH_ALL_TLBS)
            mask = (env->IBAT[1][nr] << 17) & 0x0FFE0000UL;
            do_invalidate_BAT(env, env->IBAT[0][nr], mask);
#else
            do_inval = 1;
#endif
        }
        if (value & 0x40) {
#if !defined(FLUSH_ALL_TLBS)
            mask = (value << 17) & 0x0FFE0000UL;
            do_invalidate_BAT(env, env->IBAT[0][nr], mask);
#else
            do_inval = 1;
#endif
        }
        env->IBAT[1][nr] = value;
        env->DBAT[1][nr] = value;
#if defined(FLUSH_ALL_TLBS)
        if (do_inval) {
            tlb_flush(env_cpu(env));
        }
#endif
    }
}